

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::TernaryOp::isResolved(TernaryOp *this)

{
  uint uVar1;
  int iVar2;
  Expression *pEVar3;
  byte local_11;
  TernaryOp *this_local;
  
  pEVar3 = pool_ref<soul::AST::Expression>::operator->(&this->condition);
  uVar1 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
  local_11 = 0;
  if ((uVar1 & 1) != 0) {
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&this->trueBranch);
    uVar1 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    local_11 = 0;
    if ((uVar1 & 1) != 0) {
      pEVar3 = pool_ref<soul::AST::Expression>::operator->(&this->falseBranch);
      iVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
      local_11 = (byte)iVar2;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool isResolved() const override
        {
            return condition->isResolved()
                    && trueBranch->isResolved()
                    && falseBranch->isResolved();
        }